

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O0

int run_test_udp_options6(void)

{
  int iVar1;
  undefined1 local_28 [8];
  sockaddr_in6 addr;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    addr.sin6_addr.__in6_u.__u6_addr32[3] = 1;
  }
  else {
    iVar1 = uv_ip6_addr("::",0x23a3,local_28);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
              ,0x6d,"0 == uv_ip6_addr(\"::\", TEST_PORT, &addr)");
      abort();
    }
    addr.sin6_addr.__in6_u.__u6_addr32[3] = udp_options_test((sockaddr *)local_28);
  }
  return addr.sin6_addr.__in6_u.__u6_addr32[3];
}

Assistant:

TEST_IMPL(udp_options6) {
  struct sockaddr_in6 addr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));
  return udp_options_test((const struct sockaddr*) &addr);
}